

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_function-c.cpp
# Opt level: O3

bool duckdb::CAPICastFunction(Vector *input,Vector *output,idx_t count,CastParameters *parameters)

{
  VectorType VVar1;
  char cVar2;
  CCastExecuteInfo exec_info;
  CastParameters *local_58;
  string local_50;
  
  VVar1 = input->vector_type;
  Vector::Flatten(input,count);
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_58 = parameters;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  optional_ptr<duckdb::BoundCastData,_true>::CheckValid(&parameters->cast_data);
  cVar2 = (*(code *)(parameters->cast_data).ptr[1]._vptr_BoundCastData)
                    (&local_58,count,input,output);
  if (cVar2 == '\0') {
    HandleCastError::AssignError(&local_50,parameters);
    if ((count != 1 || VVar1 != CONSTANT_VECTOR) || (parameters->strict != false))
    goto LAB_0170cc66;
  }
  else if (count != 1 || VVar1 != CONSTANT_VECTOR) goto LAB_0170cc66;
  Vector::SetVectorType(output,CONSTANT_VECTOR);
LAB_0170cc66:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return (bool)cVar2;
}

Assistant:

static bool CAPICastFunction(Vector &input, Vector &output, idx_t count, CastParameters &parameters) {

	const auto is_const = input.GetVectorType() == VectorType::CONSTANT_VECTOR;
	input.Flatten(count);

	CCastExecuteInfo exec_info(parameters);
	const auto &data = parameters.cast_data->Cast<CCastFunctionData>();

	auto c_input = reinterpret_cast<duckdb_vector>(&input);
	auto c_output = reinterpret_cast<duckdb_vector>(&output);
	auto c_info = reinterpret_cast<duckdb_function_info>(&exec_info);

	const auto success = data.function(c_info, count, c_input, c_output);

	if (!success) {
		HandleCastError::AssignError(exec_info.error_message, parameters);
	}

	if (is_const && count == 1 && (success || !parameters.strict)) {
		output.SetVectorType(VectorType::CONSTANT_VECTOR);
	}

	return success;
}